

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::CLUFactor<double>::solveUright(CLUFactor<double> *this,double *wrk,double *vec)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  pointer pdVar5;
  int *piVar6;
  int *piVar7;
  pointer pdVar8;
  int *piVar9;
  bool bVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  
  if (0 < (long)this->thedim) {
    piVar3 = (this->row).orig;
    piVar4 = (this->col).orig;
    pdVar5 = (this->diag).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->u).col.start;
    piVar7 = (this->u).col.len;
    pdVar8 = (this->u).col.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->u).col.idx;
    lVar11 = (long)this->thedim;
    do {
      iVar1 = piVar3[lVar11 + -1];
      iVar2 = piVar4[lVar11 + -1];
      dVar14 = pdVar5[iVar1] * vec[iVar1];
      wrk[iVar2] = dVar14;
      vec[iVar1] = 0.0;
      if (((dVar14 != 0.0) || (NAN(dVar14))) && (lVar12 = (long)piVar7[iVar2], 0 < lVar12)) {
        lVar13 = (long)piVar6[iVar2];
        lVar12 = lVar12 + lVar13;
        do {
          iVar1 = piVar9[lVar13];
          vec[iVar1] = vec[iVar1] - pdVar8[lVar13] * dVar14;
          lVar13 = lVar13 + 1;
        } while (lVar13 < lVar12);
      }
      bVar10 = 1 < lVar11;
      lVar11 = lVar11 + -1;
    } while (bVar10);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUright(R* wrk, R* vec) const
{

   for(int i = thedim - 1; i >= 0; i--)
   {
      int  r = row.orig[i];
      int  c = col.orig[i];
      R x = wrk[c] = diag[r] * vec[r];

      vec[r] = 0.0;

      if(x != 0.0)
         //if (isNotZero(x))
      {
         for(int j = u.col.start[c]; j < u.col.start[c] + u.col.len[c]; j++)
            vec[u.col.idx[j]] -= x * u.col.val[j];
      }
   }
}